

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *window,int n)

{
  ImU32 IVar1;
  uint in_ESI;
  long in_RDI;
  ImGuiID id;
  bool local_11;
  undefined1 local_c [12];
  
  local_11 = 7 < in_ESI;
  if (local_11) {
    __assert_fail("n >= 0 && n <= 7",
                  "/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]kbd-audio/imgui/imgui.cpp"
                  ,0x13ea,"ImGuiID ImGui::GetWindowResizeID(ImGuiWindow *, int)");
  }
  IVar1 = ImHashStr("#RESIZE",0,*(ImU32 *)(in_RDI + 8));
  IVar1 = ImHashData(local_c,4,IVar1);
  return IVar1;
}

Assistant:

ImGuiID ImGui::GetWindowResizeID(ImGuiWindow* window, int n)
{
    IM_ASSERT(n >= 0 && n <= 7);
    ImGuiID id = window->ID;
    id = ImHashStr("#RESIZE", 0, id);
    id = ImHashData(&n, sizeof(int), id);
    return id;
}